

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O1

field_t * SEM_VarDec(ast *node,attr *a,int ins)

{
  char *s;
  int iVar1;
  ast *paVar2;
  attr *paVar3;
  array_t *paVar4;
  ast *paVar5;
  value *pvVar6;
  
  while (paVar2 = child(node,1), paVar2->type == -0x2708) {
    paVar3 = (attr *)malloc(0x10);
    paVar3->kind = 1;
    paVar4 = (array_t *)malloc(0x10);
    (paVar3->field_1).array = paVar4;
    paVar4->type = a;
    paVar5 = child(node,3);
    ((paVar3->field_1).basic)->type = *(int *)paVar5->val;
    a = paVar3;
    node = paVar2;
  }
  paVar3 = a;
  if ((((a->kind == 2) && (((a->field_1).structure)->field == (field_t *)0x0)) &&
      (s = ((a->field_1).structure)->name, s != (char *)0x0)) &&
     (paVar3 = findvar(s), paVar3 == (attr *)0x0)) {
    semerror(0x11,node->pos->first_line,semErrorMsg[0x11],((a->field_1).basic)->name);
    paVar3 = a;
  }
  if ((ins != 0) && (iVar1 = insertvar(paVar2->val->typeval,paVar3), iVar1 == 0)) {
    semerror(3,paVar2->pos->first_line,semErrorMsg[3],paVar2->val->numval);
  }
  pvVar6 = (value *)malloc(0x20);
  *(undefined4 *)(pvVar6 + 2) = 0;
  pvVar6[1].typeval = (char *)paVar3;
  *pvVar6 = *paVar2->val;
  pvVar6[3].numval = 0;
  return (field_t *)pvVar6;
}

Assistant:

static struct field_t* SEM_VarDec(struct ast *node, struct attr *a, int ins) {
    struct ast *child1 = child(node, 1);
    struct attr *sa = a;
    if (child1->type == VarDec) {
        struct attr *a1 = malloc(sizeof(struct attr));
        a1->kind = ARRAY;
        a1->array = malloc(sizeof(struct array_t));
        a1->array->type = a;
        a1->array->size = (int)child(node, 3)->val->numval;
        return SEM_VarDec(child1, a1, ins);
    }
    //DONETODO: error insert
    if (a->kind == STRUCTURE && a->structure->field == NULL && a->structure->name &&
        ((sa = findvar(a->structure->name)) == NULL)) {
//            printf("no such struct\n");
        SEMERROR(UndefinedStruct, node, a->structure->name);
        sa = a;
    }
    if (ins) {
        if (insertvar(child1->val->idval, sa) == 0)
            SEMERROR(RedefinedVariable, child1, child1->val->idval);
    }
    struct field_t *f = malloc(sizeof(struct field_t));
    f->isInit = 0;
    f->type = sa;
    f->name = child1->val->idval;
    f->next = NULL;
    return f;
}